

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O3

void h2v1_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                  JSAMPARRAY *output_data_ptr)

{
  JSAMPROW pJVar1;
  JSAMPLE JVar2;
  uint uVar3;
  JSAMPARRAY ppJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  iVar8 = cinfo->max_v_samp_factor;
  if (0 < iVar8) {
    ppJVar4 = *output_data_ptr;
    lVar7 = 0;
    do {
      uVar3 = cinfo->output_width;
      if ((ulong)uVar3 != 0) {
        pJVar5 = ppJVar4[lVar7];
        pJVar6 = input_data[lVar7];
        lVar9 = 0;
        do {
          JVar2 = pJVar6[lVar9];
          pJVar1 = pJVar5 + lVar9 * 2;
          *pJVar1 = JVar2;
          pJVar1[1] = JVar2;
          lVar9 = lVar9 + 1;
        } while (pJVar1 + 2 < pJVar5 + uVar3);
        iVar8 = cinfo->max_v_samp_factor;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar8);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_upsample (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	       JSAMPARRAY input_data, JSAMPARRAY * output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  JSAMPROW outend;
  int outrow;

  for (outrow = 0; outrow < cinfo->max_v_samp_factor; outrow++) {
    inptr = input_data[outrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;	/* don't need GETJSAMPLE() here */
      *outptr++ = invalue;
      *outptr++ = invalue;
    }
  }
}